

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlElementStatusHere(void)

{
  int iVar1;
  htmlStatus val;
  int iVar2;
  uint local_34;
  int n_elt;
  htmlElemDesc *elt;
  int n_parent;
  htmlElemDesc *parent;
  htmlStatus ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = HTML_NA;
  for (elt._4_4_ = 0; (int)elt._4_4_ < 1; elt._4_4_ = elt._4_4_ + 1) {
    for (local_34 = 0; (int)local_34 < 1; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = htmlElementStatusHere(0,0);
      desret_htmlStatus(val);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlElementStatusHere",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + HTML_INVALID;
        printf(" %d",(ulong)elt._4_4_);
        printf(" %d",(ulong)local_34);
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_htmlElementStatusHere(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlStatus ret_val;
    const htmlElemDesc * parent; /* HTML parent element */
    int n_parent;
    const htmlElemDesc * elt; /* HTML element */
    int n_elt;

    for (n_parent = 0;n_parent < gen_nb_const_htmlElemDesc_ptr;n_parent++) {
    for (n_elt = 0;n_elt < gen_nb_const_htmlElemDesc_ptr;n_elt++) {
        mem_base = xmlMemBlocks();
        parent = gen_const_htmlElemDesc_ptr(n_parent, 0);
        elt = gen_const_htmlElemDesc_ptr(n_elt, 1);

        ret_val = htmlElementStatusHere(parent, elt);
        desret_htmlStatus(ret_val);
        call_tests++;
        des_const_htmlElemDesc_ptr(n_parent, parent, 0);
        des_const_htmlElemDesc_ptr(n_elt, elt, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlElementStatusHere",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_parent);
            printf(" %d", n_elt);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}